

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration_x11.cpp
# Opt level: O0

void __thiscall QOffscreenX11GLXContext::~QOffscreenX11GLXContext(QOffscreenX11GLXContext *this)

{
  Display *this_00;
  QOffscreenX11GLXContextData *pQVar1;
  Display *pDVar2;
  QPlatformOpenGLContext *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QOffscreenX11GLXContext_00135568;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QOffscreenX11GLXContext_001355e8;
  QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>::
  operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
              *)(in_RDI + 0x18));
  this_00 = QOffscreenX11Info::display((QOffscreenX11Info *)0x128987);
  pQVar1 = QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
           ::operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
                         *)(in_RDI + 0x18));
  glXDestroyContext(this_00,pQVar1->context);
  QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>::
  operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
              *)(in_RDI + 0x18));
  pDVar2 = QOffscreenX11Info::display((QOffscreenX11Info *)0x1289be);
  pQVar1 = QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
           ::operator->((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
                         *)(in_RDI + 0x18));
  XDestroyWindow(pDVar2,pQVar1->window);
  QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>::
  ~QScopedPointer((QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>
                   *)this_00);
  QNativeInterface::QGLXContext::~QGLXContext((QGLXContext *)(in_RDI + 0x10));
  QPlatformOpenGLContext::~QPlatformOpenGLContext(in_RDI);
  return;
}

Assistant:

QOffscreenX11GLXContext::~QOffscreenX11GLXContext()
{
    glXDestroyContext(d->x11->display(), d->context);
    XDestroyWindow(d->x11->display(), d->window);
}